

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svm_helper.c
# Opt level: O0

void svm_load_seg_cache(CPUX86State *env,hwaddr addr,int seg_reg)

{
  SegmentCache *sc;
  SegmentCache sc1;
  int seg_reg_local;
  hwaddr addr_local;
  CPUX86State *env_local;
  
  sc1.flags = seg_reg;
  svm_load_seg(env,addr,(SegmentCache *)&sc);
  cpu_x86_load_seg_cache(env,sc1.flags,(uint)sc,sc1._0_8_,(uint)sc1.base,sc1.base._4_4_);
  return;
}

Assistant:

static inline void svm_load_seg_cache(CPUX86State *env, hwaddr addr,
                                      int seg_reg)
{
    SegmentCache sc1, *sc = &sc1;

    svm_load_seg(env, addr, sc);
    cpu_x86_load_seg_cache(env, seg_reg, sc->selector,
                           sc->base, sc->limit, sc->flags);
}